

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

TransparentMemberSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::TransparentMemberSymbol,slang::ast::EnumValueSymbol_const&>
          (BumpAllocator *this,EnumValueSymbol *args)

{
  SourceLocation SVar1;
  size_t sVar2;
  char *pcVar3;
  TransparentMemberSymbol *pTVar4;
  
  pTVar4 = (TransparentMemberSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((TransparentMemberSymbol *)this->endPtr < pTVar4 + 1) {
    pTVar4 = (TransparentMemberSymbol *)allocateSlow(this,0x48,8);
  }
  else {
    this->head->current = (byte *)(pTVar4 + 1);
  }
  sVar2 = (args->super_ValueSymbol).super_Symbol.name._M_len;
  pcVar3 = (args->super_ValueSymbol).super_Symbol.name._M_str;
  SVar1 = (args->super_ValueSymbol).super_Symbol.location;
  (pTVar4->super_Symbol).kind = TransparentMember;
  (pTVar4->super_Symbol).name._M_len = sVar2;
  (pTVar4->super_Symbol).name._M_str = pcVar3;
  (pTVar4->super_Symbol).location = SVar1;
  (pTVar4->super_Symbol).originatingSyntax = (SyntaxNode *)0x0;
  (pTVar4->super_Symbol).parentScope = (Scope *)0x0;
  (pTVar4->super_Symbol).nextInScope = (Symbol *)0x0;
  (pTVar4->super_Symbol).indexInScope = 0;
  pTVar4->wrapped = (Symbol *)args;
  return pTVar4;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }